

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O3

ion_sl_level_t sl_gen_level(ion_skiplist_t *skiplist)

{
  int iVar1;
  int iVar2;
  ion_sl_level_t iVar3;
  
  iVar1 = rand();
  iVar3 = 0;
  if (iVar1 < (int)(0x7fffffff / (long)skiplist->pden) * skiplist->pnum) {
    iVar1 = 1;
    do {
      if (skiplist->maxheight <= iVar1) break;
      iVar1 = iVar1 + 1;
      iVar2 = rand();
    } while (iVar2 < (int)(0x7fffffff / (long)skiplist->pden) * skiplist->pnum);
    iVar3 = iVar1 + -1;
  }
  return iVar3;
}

Assistant:

ion_sl_level_t
sl_gen_level(
	ion_skiplist_t *skiplist
) {
	ion_sl_level_t level = 1;

	while ((rand() < skiplist->pnum * (RAND_MAX / skiplist->pden)) && level < skiplist->maxheight) {
		level++;
	}

	return level - 1;
}